

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::PRE::TraceFailedPreloadInLandingPad
          (PRE *this,Loop *loop,PropertySym *propertySym,char16 *reason)

{
  uint propertyId_00;
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint functionId;
  JITManager *this_00;
  ThreadContext *this_01;
  PropertyRecord *this_02;
  char16 *pcVar5;
  undefined4 *puVar6;
  PropertyRecord *fieldName;
  char16 propSymStr [32];
  SymID objectSymId;
  int32 propertyId;
  char16 *reason_local;
  PropertySym *propertySym_local;
  Loop *loop_local;
  PRE *this_local;
  
  uVar4 = Func::GetSourceContextId(this->globOpt->func);
  functionId = Func::GetLocalFunctionId(this->globOpt->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,FieldPREPhase,uVar4,functionId);
  if (bVar3) {
    propertyId_00 = propertySym->m_propertyId;
    uVar1 = (propertySym->m_stackSym->super_Sym).m_id;
    switch((propertySym->super_Sym).field_0x15) {
    case 0:
      this_00 = JITManager::GetJITManager();
      bVar3 = JITManager::IsOOPJITEnabled(this_00);
      if (bVar3) {
        swprintf_s<32ul>((WCHAR (*) [32])&fieldName,L"s%d->#%d",(ulong)uVar1,(ulong)propertyId_00);
      }
      else {
        this_01 = Func::GetInProcThreadContext(propertySym->m_func);
        this_02 = ThreadContext::GetPropertyRecord(this_01,propertyId_00);
        pcVar5 = Js::PropertyRecord::GetBuffer(this_02);
        swprintf_s<32ul>((WCHAR (*) [32])&fieldName,L"s%d->%s",(ulong)uVar1,pcVar5);
      }
      break;
    case 1:
    case 3:
      swprintf_s<32ul>((WCHAR (*) [32])&fieldName,L"s%d[%d]",(ulong)uVar1,(ulong)propertyId_00);
      break;
    case 2:
      swprintf_s<32ul>((WCHAR (*) [32])&fieldName,L"s%dl[%d]",(ulong)uVar1,(ulong)propertyId_00);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4662,"(0)","Unknown field kind");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    Output::Print(L"** TRACE: Field PRE: ");
    Func::DumpFullFunctionName(this->globOpt->func);
    uVar4 = Loop::GetLoopNumber(loop);
    Output::Print(L": Failed to pre-load (%s) in landing pad of loop #%d. Reason: %s ",&fieldName,
                  (ulong)uVar4,reason);
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void GlobOpt::PRE::TraceFailedPreloadInLandingPad(const Loop *const loop, PropertySym * propertySym, const char16* reason) const
{
    if (PHASE_TRACE(Js::FieldPREPhase, this->globOpt->func))
    {
        int32 propertyId = propertySym->m_propertyId;
        SymID objectSymId = propertySym->m_stackSym->m_id;
        char16 propSymStr[32];
        switch (propertySym->m_fieldKind)
        {
        case PropertyKindData:
            if (JITManager::GetJITManager()->IsOOPJITEnabled())
            {
                swprintf_s(propSymStr, _u("s%d->#%d"), objectSymId, propertyId);
            }
            else
            {
                Js::PropertyRecord const* fieldName = propertySym->m_func->GetInProcThreadContext()->GetPropertyRecord(propertyId);
                swprintf_s(propSymStr, _u("s%d->%s"), objectSymId, fieldName->GetBuffer());
            }
            break;
        case PropertyKindSlots:
        case PropertyKindSlotArray:
            swprintf_s(propSymStr, _u("s%d[%d]"), objectSymId, propertyId);
            break;
        case PropertyKindLocalSlots:
            swprintf_s(propSymStr, _u("s%dl[%d]"), objectSymId, propertyId);
            break;
        default:
            AssertMsg(0, "Unknown field kind");
            break;
        }

        Output::Print(_u("** TRACE: Field PRE: "));
        this->globOpt->func->DumpFullFunctionName();
        Output::Print(_u(": Failed to pre-load (%s) in landing pad of loop #%d. Reason: %s "), propSymStr, loop->GetLoopNumber(), reason);
        Output::Print(_u("\n"));
    }
}